

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ConfigMakeExprlist(Fts5Config *p)

{
  undefined1 local_28 [8];
  Fts5Buffer buf;
  int rc;
  int i;
  Fts5Config *p_local;
  
  buf.n = 0;
  memset(local_28,0,0x10);
  sqlite3Fts5BufferAppendPrintf(&buf.n,(Fts5Buffer *)local_28,"T.%Q",p->zContentRowid);
  if (p->eContent != 1) {
    for (buf.nSpace = 0; buf.nSpace < p->nCol; buf.nSpace = buf.nSpace + 1) {
      if (p->eContent == 2) {
        sqlite3Fts5BufferAppendPrintf(&buf.n,(Fts5Buffer *)local_28,", T.%Q",p->azCol[buf.nSpace]);
      }
      else {
        sqlite3Fts5BufferAppendPrintf
                  (&buf.n,(Fts5Buffer *)local_28,", T.c%d",(ulong)(uint)buf.nSpace);
      }
    }
  }
  p->zContentExprlist = (char *)local_28;
  return buf.n;
}

Assistant:

static int fts5ConfigMakeExprlist(Fts5Config *p){
  int i;
  int rc = SQLITE_OK;
  Fts5Buffer buf = {0, 0, 0};

  sqlite3Fts5BufferAppendPrintf(&rc, &buf, "T.%Q", p->zContentRowid);
  if( p->eContent!=FTS5_CONTENT_NONE ){
    for(i=0; i<p->nCol; i++){
      if( p->eContent==FTS5_CONTENT_EXTERNAL ){
        sqlite3Fts5BufferAppendPrintf(&rc, &buf, ", T.%Q", p->azCol[i]);
      }else{
        sqlite3Fts5BufferAppendPrintf(&rc, &buf, ", T.c%d", i);
      }
    }
  }

  assert( p->zContentExprlist==0 );
  p->zContentExprlist = (char*)buf.p;
  return rc;
}